

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cc
# Opt level: O3

void __thiscall dnet::nn::relu::relu(relu *this,axes_type *input_shape)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  uint __val;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  string __str;
  char *local_70;
  uint local_68;
  char local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->super_activation).super_op.id._M_dataplus._M_p =
       (pointer)&(this->super_activation).super_op.id.field_2;
  (this->super_activation).super_op.id._M_string_length = 0;
  (this->super_activation).super_op.id.field_2._M_local_buf[0] = '\0';
  (this->super_activation).super_op._vptr_op = (_func_int **)&PTR_forwardp_0014da70;
  data_types::matrix::matrix(&this->_prev_x,input_shape);
  *(undefined8 *)(this->super_activation).super_op.input_shape._M_elems =
       *(undefined8 *)input_shape->_M_elems;
  *(undefined8 *)(this->super_activation).super_op.output_shape._M_elems =
       *(undefined8 *)input_shape->_M_elems;
  __val = misc::rand_int(100000);
  cVar3 = '\x01';
  if (9 < __val) {
    uVar6 = __val;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar6 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0011314a;
      }
      if (uVar6 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0011314a;
      }
      if (uVar6 < 10000) goto LAB_0011314a;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_0011314a:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70,local_68,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x137da8);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar5;
    local_50 = (long *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_activation).super_op.id,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

relu::relu(const tensor<double, 2>::axes_type &input_shape)
            : _prev_x(input_shape), activation(input_shape)
        {
            this->input_shape = input_shape;
            this->output_shape = input_shape;
            this->id = "ReLU_" + std::to_string(dnet::misc::rand_int(100000));
        }